

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

float mpack_load_float(char *p)

{
  float fVar1;
  anon_union_4_2_947300b0 v;
  char *p_local;
  
  fVar1 = (float)mpack_load_u32(p);
  return fVar1;
}

Assistant:

MPACK_INLINE float mpack_load_float(const char* p) {
    MPACK_CHECK_FLOAT_ORDER();
    union {
        float f;
        uint32_t u;
    } v;
    v.u = mpack_load_u32(p);
    return v.f;
}